

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O1

void llbuild::basic::spawnProcess
               (ProcessDelegate *delegate,ProcessContext *ctx,ProcessGroup *pgrp,
               ProcessHandle handle,ArrayRef<llvm::StringRef> commandLine,
               POSIXEnvironment *environment,ProcessAttributes attr,ProcessReleaseFn *releaseFn,
               ProcessCompletionFn *completionFn)

{
  mutex *__mutex;
  size_type sVar1;
  _Manager_type p_Var2;
  undefined1 auVar3 [16];
  Child LHS;
  Child CVar4;
  Child CVar5;
  Child CVar6;
  Child CVar7;
  StringRef value;
  StringRef value_00;
  FileDescriptor FVar8;
  FileDescriptor __fd;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  pointer __argv;
  bool bVar11;
  char cVar12;
  int iVar13;
  undefined4 extraout_var;
  uint *puVar14;
  long *plVar15;
  char **__envp;
  int *piVar16;
  Child CVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  Child RHS;
  Child RHS_00;
  Child RHS_01;
  Child RHS_02;
  NodeKind NVar20;
  undefined1 uVar21;
  long lVar22;
  Child CVar23;
  Child **ppCVar24;
  int i;
  int iVar25;
  long lVar26;
  char *pcVar27;
  Child LHS_00;
  Child CVar28;
  NodeKind NVar29;
  StringRef *pSVar30;
  bool bVar31;
  ProcessGroup *pPVar32;
  int i_1;
  Child *pCVar33;
  ulong uVar34;
  bool bVar35;
  uint uVar36;
  uint uVar37;
  undefined4 uVar38;
  StringRef Name;
  StringRef key;
  StringRef key_00;
  ManagedDescriptor outputPipeParentEnd;
  ManagedDescriptor controlPipeParentEnd;
  pollfd readfds [2];
  string whatPipe;
  function<bool_(llvm::StringRef)> readCbs [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsStorage;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  ControlProtocolState control;
  string workingDir;
  posix_spawn_file_actions_t fileActions;
  Twine taskID;
  posix_spawnattr_t attributes;
  sigset_t mostSignals;
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  sigset_t noSignals;
  uint local_159c;
  Child local_1598;
  Child local_1590;
  Child local_1588;
  uint local_157c;
  undefined1 local_1578 [12];
  undefined4 uStack_156c;
  undefined8 local_1568;
  code *pcStack_1560;
  _Manager_type *local_1558;
  ManagedDescriptor local_1550;
  Child local_1538;
  uint uStack_1530;
  undefined4 uStack_152c;
  NodeKind local_1528;
  NodeKind NStack_1527;
  undefined6 uStack_1526;
  Child local_1520;
  uint uStack_1518;
  undefined4 uStack_1514;
  NodeKind local_1510;
  char cStack_150f;
  undefined6 uStack_150e;
  undefined8 local_1508;
  ManagedDescriptor local_1500;
  pollfd local_14e8;
  uint uStack_14e0;
  undefined4 uStack_14dc;
  NodeKind local_14d8;
  char cStack_14d7;
  undefined6 uStack_14d6;
  ProcessGroup *local_14d0;
  Child local_14c8;
  Child CStack_14c0;
  undefined8 local_14b8;
  Child CStack_14b0;
  Child local_14a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_14a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1498;
  Twine *local_1490;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1488;
  _Any_data local_1480;
  _Manager_type local_1470;
  Child CStack_1468;
  _func_int **local_1458;
  Child local_1450;
  uint uStack_1448;
  undefined4 uStack_1444;
  NodeKind local_1440;
  char cStack_143f;
  undefined6 uStack_143e;
  Child local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  Child CStack_1420;
  Child *local_1418;
  undefined8 uStack_1410;
  Child *local_1408;
  code *pcStack_1400;
  Child local_13f8;
  uint uStack_13f0;
  undefined4 uStack_13ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13d8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_13c0;
  Child local_13a8;
  uint uStack_13a0;
  undefined4 uStack_139c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1398;
  undefined1 local_1388;
  undefined1 *local_1380;
  undefined8 local_1378;
  undefined1 local_1370;
  undefined7 uStack_136f;
  char local_1360;
  undefined8 local_1358;
  Child local_1350;
  uint local_1348;
  undefined4 uStack_1344;
  uint uStack_1340;
  undefined4 uStack_133c;
  NodeKind local_1338;
  char cStack_1337;
  undefined6 uStack_1336;
  undefined1 *local_1330;
  long local_1328;
  undefined1 local_1320;
  undefined7 uStack_131f;
  undefined4 uStack_130c;
  undefined4 local_1308;
  undefined4 uStack_1304;
  undefined4 uStack_1300;
  undefined4 uStack_12fc;
  undefined8 local_12f8;
  posix_spawn_file_actions_t local_12f0;
  Twine local_12a0;
  posix_spawnattr_t local_1288;
  sigset_t local_1138;
  undefined1 local_10b8 [8];
  Child CStack_10b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_10a8;
  ulong local_1098;
  sigset_t local_b0;
  
  bVar31 = attr.connectToConsole;
  local_159c = 0xffffffff;
  if (attr.connectToConsole == true) {
    attr.controlEnabled = false;
  }
  local_1598 = (Child)handle.id;
  local_1590 = (Child)delegate;
  local_1588 = (Child)ctx;
  if (commandLine.Length == 0) {
    local_1288.__flags = 1;
    local_1288._2_2_ = 0;
    local_1288.__pgrp = -1;
    local_1288.__sd.__val[0]._0_4_ = 0xffffffff;
    local_1288.__sd.__val[1] = 0;
    local_1288.__sd.__val[2] = 0;
    local_1288.__sd.__val[3] = 0;
    (*delegate->_vptr_ProcessDelegate[2])(delegate,ctx,handle.id,0xffffffff);
    CVar17 = local_1598;
    llvm::Twine::Twine((Twine *)local_10b8,"no arguments for command");
    (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,CVar17.twine,(Twine *)local_10b8);
    (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,local_1598.twine,&local_1288);
    local_1098 = local_1288.__sd.__val[3];
    aStack_10a8._M_allocated_capacity._0_2_ = (undefined2)local_1288.__sd.__val[1];
    aStack_10a8._M_allocated_capacity._2_2_ = (undefined2)(local_1288.__sd.__val[1] >> 0x10);
    aStack_10a8._M_allocated_capacity._4_4_ = (undefined4)(local_1288.__sd.__val[1] >> 0x20);
    aStack_10a8._8_4_ = (undefined4)local_1288.__sd.__val[2];
    aStack_10a8._12_4_ = (undefined4)(local_1288.__sd.__val[2] >> 0x20);
    local_10b8._0_4_ = local_1288._0_4_;
    local_10b8._4_4_ = local_1288.__pgrp;
    CStack_10b0.decUI = (uint)local_1288.__sd.__val[0];
    CStack_10b0._4_4_ = local_1288.__sd.__val[0]._4_4_;
    if ((completionFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*completionFn->_M_invoker)((_Any_data *)completionFn,(ProcessResult *)local_10b8);
      return;
    }
    goto LAB_001e2b25;
  }
  pSVar30 = commandLine.Data + commandLine.Length;
  local_13d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_13d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_13d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_initialize<llvm::StringRef_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_13d8,
             commandLine.Data,pSVar30);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_13c0,
             ((long)local_13d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_13d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1,(allocator_type *)local_10b8
            );
  if (local_13d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_13d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar22 = 0;
  }
  else {
    lVar18 = 0;
    lVar26 = 0;
    do {
      local_13c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar26] =
           *(char **)((long)&((local_13d8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar18);
      lVar26 = lVar26 + 1;
      lVar22 = (long)local_13d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_13d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar18 = lVar18 + 0x20;
    } while (lVar26 != lVar22);
  }
  local_13c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[lVar22] = (char *)0x0;
  local_14d0 = pgrp;
  posix_spawnattr_init(&local_1288);
  sigemptyset(&local_b0);
  posix_spawnattr_setsigmask(&local_1288,&local_b0);
  sigemptyset(&local_1138);
  iVar25 = 1;
  do {
    if ((iVar25 != 9) && (iVar25 != 0x13)) {
      sigaddset(&local_1138,iVar25);
    }
    iVar25 = iVar25 + 1;
  } while (iVar25 != 0x1f);
  posix_spawnattr_setsigdefault(&local_1288,&local_1138);
  posix_spawnattr_setpgroup(&local_1288,0);
  posix_spawnattr_setflags(&local_1288,(ushort)(bVar31 ^ 1) * 2 + 0xc);
  posix_spawn_file_actions_init(&local_12f0);
  local_1330 = &local_1320;
  if (attr.workingDir.Data == (char *)0x0) {
    local_1328 = 0;
    local_1320 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1330,attr.workingDir.Data,
               attr.workingDir.Data + attr.workingDir.Length);
  }
  bVar35 = true;
  if (local_1328 != 0) {
    iVar25 = posix_spawn_file_actions_addchdir_np(&local_12f0,local_1330);
    bVar35 = iVar25 == 0x26;
  }
  local_1550._descriptor = 0xffffffff;
  local_1550._closedProperly = true;
  local_1550._file =
       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
  ;
  local_1550._line = 799;
  local_1500._descriptor = 0xffffffff;
  local_1500._closedProperly = true;
  local_1500._file =
       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
  ;
  local_1500._line = 800;
  llvm::Twine::Twine(&local_12a0,(Twine *)&local_1598,UHexKind,(Child)0x0,EmptyKind);
  llvm::Twine::str_abi_cxx11_((string *)local_10b8,&local_12a0);
  value.Data._4_4_ = local_10b8._4_4_;
  value.Data._0_4_ = local_10b8._0_4_;
  value.Length._0_4_ = CStack_10b0.decUI;
  value.Length._4_4_ = CStack_10b0._4_4_;
  key.Length = 0xf;
  key.Data = "LLBUILD_TASK_ID";
  POSIXEnvironment::setIfMissing(environment,key,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_) != &aStack_10a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                    CONCAT44(aStack_10a8._M_allocated_capacity._4_4_,
                             CONCAT22(aStack_10a8._M_allocated_capacity._2_2_,
                                      aStack_10a8._M_allocated_capacity._0_2_)) + 1);
  }
  llvm::Twine::Twine((Twine *)local_10b8,
                     local_13d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  bVar11 = llvm::sys::path::is_absolute((Twine *)local_10b8,native);
  pPVar32 = local_14d0;
  if (!bVar11) {
    Name.Length = 0;
    Name.Data = (char *)(local_13d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pSVar30;
    llvm::sys::findProgramByName_abi_cxx11_
              ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_10b8,
               (sys *)((local_13d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,Name,
               (ArrayRef<llvm::StringRef>)(auVar3 << 0x40));
    if (((local_1098 & 1) == 0) || (local_10b8._0_4_ == 0)) {
      if ((local_1098 & 1) != 0) {
        __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/ErrorOr.h"
                      ,0xf4,
                      "storage_type *llvm::ErrorOr<std::basic_string<char>>::getStorage() [T = std::basic_string<char>]"
                     );
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 local_13d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      *local_13c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start =
           ((local_13d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    }
    if (((local_1098 & 1) == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_) != &aStack_10a8)) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                      CONCAT44(aStack_10a8._M_allocated_capacity._4_4_,
                               CONCAT22(aStack_10a8._M_allocated_capacity._2_2_,
                                        aStack_10a8._M_allocated_capacity._0_2_)) + 1);
    }
  }
  __mutex = &pPVar32->mutex;
  iVar25 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar25 != 0) {
    std::__throw_system_error(iVar25);
  }
  bVar11 = false;
  local_1458 = (_func_int **)CONCAT71(local_1458._1_7_,pPVar32->closed);
  if (pPVar32->closed == false) {
    if (bVar31 == false) {
      posix_spawn_file_actions_addopen(&local_12f0,0,"/dev/null",0,0);
      local_10b8._0_4_ = 0xffffffff;
      local_10b8._4_4_ = 0xffffffff;
      iVar25 = sys::pipe((int *)local_10b8);
      FVar8 = local_1550._descriptor;
      if (iVar25 < 0) {
        puVar14 = (uint *)__errno_location();
        uVar34 = ((ulong)*puVar14 << 0x20) + 1;
        puVar14 = (uint *)CONCAT71((int7)((ulong)puVar14 >> 8),1);
        bVar31 = true;
        local_1558 = (_Manager_type *)CONCAT44(local_1558._4_4_,0xffffffff);
      }
      else {
        if (-1 < local_1550._descriptor) {
          local_1550._descriptor = -1;
          local_1550._closedProperly = true;
          sys::close(FVar8);
        }
        local_1550._descriptor = local_10b8._0_4_;
        local_1550._4_4_ = local_1550._4_4_ & 0xffffff00;
        uVar34 = 0xffffffff;
        local_10b8._0_4_ = 0xffffffff;
        bVar31 = false;
        ManagedDescriptor::childMayInherit(&local_1550,false);
        uVar38 = local_10b8._4_4_;
        local_10b8._4_4_ = 0xffffffff;
        posix_spawn_file_actions_adddup2(&local_12f0,uVar38,1);
        posix_spawn_file_actions_adddup2(&local_12f0,uVar38,2);
        local_1558 = (_Manager_type *)CONCAT44(local_1558._4_4_,uVar38);
        iVar13 = posix_spawn_file_actions_addclose(&local_12f0,uVar38);
        puVar14 = (uint *)CONCAT44(extraout_var,iVar13);
        pPVar32 = local_14d0;
      }
      if (-1 < iVar25) goto LAB_001e1430;
LAB_001e153a:
      local_1508 = CONCAT71((int7)((ulong)puVar14 >> 8),1);
      local_157c = 0xffffffff;
    }
    else {
      posix_spawn_file_actions_adddup2(&local_12f0,0,0);
      posix_spawn_file_actions_adddup2(&local_12f0,1,1);
      posix_spawn_file_actions_adddup2(&local_12f0,2,2);
      bVar31 = true;
      local_1558 = (_Manager_type *)CONCAT44(local_1558._4_4_,0xffffffff);
LAB_001e1430:
      if (attr.controlEnabled == true) {
        local_10b8._0_4_ = 0xffffffff;
        local_10b8._4_4_ = 0xffffffff;
        iVar25 = sys::pipe((int *)local_10b8);
        __fd = local_1500._descriptor;
        FVar8 = local_1550._descriptor;
        if (iVar25 < 0) {
          if (-1 < local_1550._descriptor) {
            local_1550._descriptor = 0xffffffff;
            local_1550._closedProperly = true;
            sys::close(FVar8);
          }
          if (-1 < (int)local_1558) {
            sys::close((int)local_1558);
            bVar31 = true;
            local_1558 = (_Manager_type *)CONCAT44(local_1558._4_4_,0xffffffff);
          }
          puVar14 = (uint *)__errno_location();
          uVar34 = (ulong)*puVar14 << 0x20 | 2;
          goto LAB_001e153a;
        }
        if (-1 < local_1500._descriptor) {
          local_1500._descriptor = -1;
          local_1500._closedProperly = true;
          sys::close(__fd);
        }
        local_1500._descriptor = local_10b8._0_4_;
        local_1500._4_4_ = local_1500._4_4_ & 0xffffff00;
        local_10b8._0_4_ = 0xffffffff;
        uVar34 = 0;
        ManagedDescriptor::childMayInherit(&local_1500,false);
        local_157c = local_10b8._4_4_;
        local_10b8._4_4_ = 0xffffffff;
        posix_spawn_file_actions_adddup2(&local_12f0,local_157c,local_157c);
        local_1508 = 0;
      }
      else {
        local_1508 = CONCAT71((int7)((ulong)&attr >> 8),1);
        local_157c = 0xffffffff;
        uVar34 = 0;
      }
    }
    uVar36 = local_157c;
    iVar25 = (int)uVar34;
    if (iVar25 == 0) {
      if (-1 < (int)local_157c) {
        local_13a8._4_4_ = 0;
        local_13a8.decI = local_157c;
        local_14c8.twine = (Twine *)&local_13a8;
        local_14b8 = (code *)CONCAT62(local_14b8._2_6_,0x10e);
        llvm::Twine::str_abi_cxx11_((string *)local_10b8,(Twine *)&local_14c8);
        value_00.Data._4_4_ = local_10b8._4_4_;
        value_00.Data._0_4_ = local_10b8._0_4_;
        value_00.Length._0_4_ = CStack_10b0.decUI;
        value_00.Length._4_4_ = CStack_10b0._4_4_;
        key_00.Length = 0x12;
        key_00.Data = "LLBUILD_CONTROL_FD";
        POSIXEnvironment::setIfMissing(environment,key_00,value_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_) != &aStack_10a8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                          CONCAT44(aStack_10a8._M_allocated_capacity._4_4_,
                                   CONCAT22(aStack_10a8._M_allocated_capacity._2_2_,
                                            aStack_10a8._M_allocated_capacity._0_2_)) + 1);
        }
      }
      __argv = local_13c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar25 = -1;
      bVar35 = (bool)(bVar35 & local_1328 != 0);
      if (!bVar35) {
        pcVar27 = *local_13c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        __envp = POSIXEnvironment::getEnvp(environment);
        pPVar32 = local_14d0;
        iVar25 = posix_spawn((pid_t *)&local_159c,pcVar27,&local_12f0,&local_1288,__argv,__envp);
      }
      (**(code **)(*local_1590.decUL + 0x10))
                (local_1590.twine,local_1588.twine,local_1598.twine,local_159c);
      if (iVar25 == 0) {
        local_10b8[4] = attr.canSafelyInterrupt;
        local_10b8._0_4_ = local_159c;
        std::
        _Hashtable<int,std::pair<int_const,llbuild::basic::ProcessInfo>,std::allocator<std::pair<int_const,llbuild::basic::ProcessInfo>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<int,llbuild::basic::ProcessInfo>>(pPVar32);
        cVar12 = (char)local_1508;
      }
      else {
        local_10b8._0_4_ = 1;
        local_10b8._4_4_ = 0xffffffff;
        CStack_10b0.decUI = 0xffffffff;
        aStack_10a8._M_local_buf[0] = NullKind;
        aStack_10a8._M_local_buf[1] = NullKind;
        aStack_10a8._M_allocated_capacity._2_2_ = 0;
        aStack_10a8._M_allocated_capacity._4_4_ = 0;
        aStack_10a8._8_4_ = 0;
        aStack_10a8._12_4_ = 0;
        local_1098 = 0;
        local_1350.twine = local_1598.twine;
        if (bVar35) {
          llvm::Twine::Twine((Twine *)&local_14c8,"working-directory unsupported on this platform");
          cVar12 = (char)local_1508;
        }
        else {
          llvm::Twine::Twine((Twine *)&local_1520,"unable to spawn process \'");
          llvm::Twine::Twine((Twine *)&local_1538,
                             local_13d8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if ((local_1510 == NullKind) || (local_1528 == NullKind)) {
            local_1568 = (code *)CONCAT62(local_1568._2_6_,0x100);
          }
          else {
            if (local_1510 == EmptyKind) {
              local_1568 = (code *)CONCAT62(uStack_1526,CONCAT11(NStack_1527,local_1528));
              local_1578._0_4_ = local_1538.decUI;
              local_1578._4_4_ = local_1538._4_4_;
              local_1578._8_4_ = uStack_1530;
              uStack_156c = uStack_152c;
            }
            else {
              if (local_1528 != EmptyKind) {
                CVar17._4_4_ = local_1520._4_4_;
                CVar17.decUI = local_1520.decUI;
                NVar20 = local_1510;
                if (cStack_150f != '\x01') {
                  CVar17.twine = (Twine *)&local_1520;
                  NVar20 = TwineKind;
                }
                NVar29 = local_1528;
                if (NStack_1527 != EmptyKind) {
                  NVar29 = TwineKind;
                }
                CVar28._4_4_ = local_1538._4_4_;
                CVar28.decUI = local_1538.decUI;
                CVar23.twine = (Twine *)&local_1538;
                if (NStack_1527 == EmptyKind) {
                  CVar23 = CVar28;
                }
                llvm::Twine::Twine((Twine *)local_1578,CVar17,NVar20,CVar23,NVar29);
                goto LAB_001e1b78;
              }
              local_1568 = (code *)CONCAT62(uStack_150e,CONCAT11(cStack_150f,local_1510));
              local_1578._0_4_ = local_1520.decUI;
              local_1578._4_4_ = local_1520._4_4_;
              local_1578._8_4_ = uStack_1518;
              uStack_156c = uStack_1514;
            }
          }
LAB_001e1b78:
          llvm::Twine::Twine((Twine *)&local_1450,"\' (");
          if (((NodeKind)local_1568 == NullKind) || (local_1440 == NullKind)) {
            local_1428 = (code *)CONCAT62(local_1428._2_6_,0x100);
          }
          else {
            if ((NodeKind)local_1568 == EmptyKind) {
              local_1428 = (code *)CONCAT62(uStack_143e,CONCAT11(cStack_143f,local_1440));
              local_1438.decUI = local_1450.decUI;
              local_1438._4_4_ = local_1450._4_4_;
              uVar37 = uStack_1448;
              uVar38 = uStack_1444;
            }
            else {
              if (local_1440 != EmptyKind) {
                CVar17 = (Child)local_1578._0_8_;
                NVar20 = (NodeKind)local_1568;
                if (local_1568._1_1_ != EmptyKind) {
                  CVar17.twine = (Twine *)local_1578;
                  NVar20 = TwineKind;
                }
                NVar29 = local_1440;
                if (cStack_143f != '\x01') {
                  NVar29 = TwineKind;
                }
                CVar23._4_4_ = local_1450._4_4_;
                CVar23.decUI = local_1450.decUI;
                CVar28.twine = (Twine *)&local_1450;
                if (cStack_143f == '\x01') {
                  CVar28 = CVar23;
                }
                llvm::Twine::Twine((Twine *)&local_1438,CVar17,NVar20,CVar28,NVar29);
                goto LAB_001e1c38;
              }
              local_1428 = local_1568;
              local_1438.decUI = local_1578._0_4_;
              local_1438._4_4_ = local_1578._4_4_;
              uVar37 = local_1578._8_4_;
              uVar38 = uStack_156c;
            }
            uStack_1430 = CONCAT44(uVar38,uVar37);
          }
LAB_001e1c38:
          sys::strerror_abi_cxx11_((sys *)&local_13f8.character,iVar25);
          llvm::Twine::Twine((Twine *)&local_14e8,(string *)&local_13f8);
          cVar12 = (char)local_1508;
          if (((NodeKind)local_1428 == NullKind) || (local_14d8 == NullKind)) {
            local_1398._M_allocated_capacity._0_2_ = 0x100;
          }
          else {
            if ((NodeKind)local_1428 == EmptyKind) {
              local_1398._M_allocated_capacity =
                   CONCAT62(uStack_14d6,CONCAT11(cStack_14d7,local_14d8));
              local_13a8.decUI = local_14e8.fd;
              local_13a8._4_4_ = CONCAT22(local_14e8.revents,local_14e8.events);
              uStack_13a0 = uStack_14e0;
              uStack_139c = uStack_14dc;
            }
            else {
              if (local_14d8 != EmptyKind) {
                CVar17 = local_1438;
                NVar20 = (NodeKind)local_1428;
                if (local_1428._1_1_ != '\x01') {
                  CVar17.twine = (Twine *)&local_1438;
                  NVar20 = TwineKind;
                }
                if (cStack_14d7 != '\x01') {
                  local_14d8 = TwineKind;
                }
                CVar6._4_2_ = local_14e8.events;
                CVar6.decUI = local_14e8.fd;
                CVar6._6_2_ = local_14e8.revents;
                CVar28.twine = (Twine *)&local_14e8;
                if (cStack_14d7 == '\x01') {
                  CVar28 = CVar6;
                }
                llvm::Twine::Twine((Twine *)&local_13a8,CVar17,NVar20,CVar28,local_14d8);
                goto LAB_001e1d23;
              }
              local_1398._M_allocated_capacity = (size_type)local_1428;
              local_13a8.decUI = local_1438.decUI;
              local_13a8._4_4_ = local_1438._4_4_;
              uStack_13a0 = (uint)uStack_1430;
              uStack_139c = uStack_1430._4_4_;
            }
          }
LAB_001e1d23:
          llvm::Twine::Twine((Twine *)&local_1348,")");
          if ((local_1398._M_local_buf[0] == NullKind) || (local_1338 == NullKind)) {
            local_14b8 = (code *)CONCAT62(local_14b8._2_6_,0x100);
          }
          else {
            if (local_1398._M_local_buf[0] == EmptyKind) {
              local_14b8 = (code *)CONCAT62(uStack_1336,CONCAT11(cStack_1337,local_1338));
            }
            else {
              if (local_1338 != EmptyKind) {
                CVar17 = local_13a8;
                uVar21 = local_1398._M_local_buf[0];
                if (local_1398._M_local_buf[1] != '\x01') {
                  CVar17.twine = (Twine *)&local_13a8;
                  uVar21 = TwineKind;
                }
                if (cStack_1337 != '\x01') {
                  local_1338 = TwineKind;
                }
                CVar7._4_4_ = uStack_1344;
                CVar7.decUI = local_1348;
                CVar28.twine = (Twine *)&local_1348;
                if (cStack_1337 == '\x01') {
                  CVar28 = CVar7;
                }
                llvm::Twine::Twine((Twine *)&local_14c8,CVar17,uVar21,CVar28,local_1338);
                goto LAB_001e1def;
              }
              local_14b8 = (code *)local_1398._M_allocated_capacity;
              local_1348 = local_13a8.decUI;
              uStack_1344 = local_13a8._4_4_;
              uStack_1340 = uStack_13a0;
              uStack_133c = uStack_139c;
            }
            local_14c8._4_4_ = uStack_1344;
            local_14c8.decUI = local_1348;
            CStack_14c0._4_4_ = uStack_133c;
            CStack_14c0.decUI = uStack_1340;
          }
        }
LAB_001e1def:
        (**(code **)(*local_1590.decUL + 0x18))
                  (local_1590.twine,local_1588.twine,local_1350.twine,&local_14c8);
        if ((!bVar35) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_13f8._4_4_,local_13f8.decUI) != &local_13e8)) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_13f8._4_4_,local_13f8.decUI),
                          (ulong)(local_13e8._M_allocated_capacity + 1));
        }
        (**(code **)(*local_1590.decUL + 0x28))
                  (local_1590.twine,local_1588.twine,local_1598.twine,local_10b8);
        local_159c = 0xffffffff;
      }
      if (-1 < (int)uVar36) {
        sys::close(uVar36);
        cVar12 = '\x01';
        uVar36 = 0xffffffff;
      }
      if (-1 < (int)local_1558) {
        sys::close((int)local_1558);
        bVar31 = true;
      }
      bVar35 = false;
      bVar11 = false;
    }
    else {
      pcVar27 = "control pipe";
      if (iVar25 == 1) {
        pcVar27 = "output pipe";
      }
      local_14c8.twine = (Twine *)&local_14b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_14c8,pcVar27,pcVar27 + (0xc - (ulong)(iVar25 == 1)));
      posix_spawn_file_actions_destroy(&local_12f0);
      posix_spawnattr_destroy(&local_1288);
      (**(code **)(*local_1590.decUL + 0x10))
                (local_1590.twine,local_1588.twine,local_1598.twine,local_159c);
      CVar17 = local_1598;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_13a8,"unable to open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_14c8);
      plVar15 = (long *)std::__cxx11::string::append(&local_13a8.character);
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 == paVar19) {
        sVar1 = paVar19->_M_allocated_capacity;
        aStack_10a8._M_allocated_capacity._0_2_ = (undefined2)sVar1;
        aStack_10a8._M_allocated_capacity._2_2_ = (undefined2)(sVar1 >> 0x10);
        aStack_10a8._M_allocated_capacity._4_4_ = (undefined4)(sVar1 >> 0x20);
        aStack_10a8._8_4_ = (undefined4)plVar15[3];
        aStack_10a8._12_4_ = (undefined4)((ulong)plVar15[3] >> 0x20);
        local_10b8 = (undefined1  [8])&aStack_10a8;
      }
      else {
        sVar1 = paVar19->_M_allocated_capacity;
        aStack_10a8._M_allocated_capacity._0_2_ = (undefined2)sVar1;
        aStack_10a8._M_allocated_capacity._2_2_ = (undefined2)(sVar1 >> 0x10);
        aStack_10a8._M_allocated_capacity._4_4_ = (undefined4)(sVar1 >> 0x20);
        local_10b8 = (undefined1  [8])*plVar15;
      }
      CStack_10b0.decUI = (uint)plVar15[1];
      CStack_10b0._4_4_ = (undefined4)((ulong)plVar15[1] >> 0x20);
      *plVar15 = (long)paVar19;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      llvm::Twine::Twine((Twine *)local_1578,(string *)local_10b8);
      pcVar27 = strerror((int)(uVar34 >> 0x20));
      llvm::Twine::Twine((Twine *)&local_1520,pcVar27);
      if (((NodeKind)local_1568 == NullKind) || (local_1510 == NullKind)) {
        local_13e8._M_allocated_capacity._0_2_ = 0x100;
      }
      else if ((NodeKind)local_1568 == EmptyKind) {
        local_13e8._M_allocated_capacity = CONCAT62(uStack_150e,CONCAT11(cStack_150f,local_1510));
        local_13f8.decUI = local_1520.decUI;
        local_13f8._4_4_ = local_1520._4_4_;
        uStack_13f0 = uStack_1518;
        uStack_13ec = uStack_1514;
      }
      else if (local_1510 == EmptyKind) {
        local_13e8._M_allocated_capacity = (size_type)local_1568;
        local_13f8.decUI = local_1578._0_4_;
        local_13f8._4_4_ = local_1578._4_4_;
        uStack_13f0 = local_1578._8_4_;
        uStack_13ec = uStack_156c;
      }
      else {
        CVar28 = (Child)local_1578._0_8_;
        NVar20 = (NodeKind)local_1568;
        if (local_1568._1_1_ != EmptyKind) {
          CVar28.twine = (Twine *)local_1578;
          NVar20 = TwineKind;
        }
        NVar29 = local_1510;
        if (cStack_150f != '\x01') {
          NVar29 = TwineKind;
        }
        CVar5._4_4_ = local_1520._4_4_;
        CVar5.decUI = local_1520.decUI;
        CVar23.twine = (Twine *)&local_1520;
        if (cStack_150f == '\x01') {
          CVar23 = CVar5;
        }
        llvm::Twine::Twine((Twine *)&local_13f8,CVar28,NVar20,CVar23,NVar29);
      }
      llvm::Twine::Twine((Twine *)&local_1538,")");
      if ((local_13e8._M_local_buf[0] == NullKind) || (local_1528 == NullKind)) {
        local_1428 = (code *)CONCAT62(local_1428._2_6_,0x100);
      }
      else {
        if (local_13e8._M_local_buf[0] == EmptyKind) {
          local_1428 = (code *)CONCAT62(uStack_1526,CONCAT11(NStack_1527,local_1528));
          local_1438.decUI = local_1538.decUI;
          local_1438._4_4_ = local_1538._4_4_;
          uVar36 = uStack_1530;
          uVar38 = uStack_152c;
        }
        else {
          if (local_1528 != EmptyKind) {
            LHS._4_4_ = local_13f8._4_4_;
            LHS.decUI = local_13f8.decUI;
            uVar21 = local_13e8._M_local_buf[0];
            if (local_13e8._M_local_buf[1] != '\x01') {
              LHS.twine = (Twine *)&local_13f8;
              uVar21 = TwineKind;
            }
            NVar20 = local_1528;
            if (NStack_1527 != EmptyKind) {
              NVar20 = TwineKind;
            }
            CVar4._4_4_ = local_1538._4_4_;
            CVar4.decUI = local_1538.decUI;
            CVar28.twine = (Twine *)&local_1538;
            if (NStack_1527 == EmptyKind) {
              CVar28 = CVar4;
            }
            llvm::Twine::Twine((Twine *)&local_1438,LHS,uVar21,CVar28,NVar20);
            goto LAB_001e19fe;
          }
          local_1428 = (code *)local_13e8._M_allocated_capacity;
          local_1438.decUI = local_13f8.decUI;
          local_1438._4_4_ = local_13f8._4_4_;
          uVar36 = uStack_13f0;
          uVar38 = uStack_13ec;
        }
        uStack_1430 = CONCAT44(uVar38,uVar36);
      }
LAB_001e19fe:
      (**(code **)(*local_1590.decUL + 0x18))
                (local_1590.twine,local_1588.twine,CVar17.twine,&local_1438);
      if (local_10b8 != (undefined1  [8])&aStack_10a8) {
        operator_delete((void *)local_10b8,
                        CONCAT44(aStack_10a8._M_allocated_capacity._4_4_,
                                 CONCAT22(aStack_10a8._M_allocated_capacity._2_2_,
                                          aStack_10a8._M_allocated_capacity._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13a8.twine != &local_1398) {
        operator_delete(local_13a8.twine,(ulong)(local_1398._M_allocated_capacity + 1));
      }
      local_10b8._0_4_ = 1;
      local_10b8._4_4_ = 0xffffffff;
      CStack_10b0.decUI = 0xffffffff;
      aStack_10a8._M_local_buf[0] = NullKind;
      aStack_10a8._M_local_buf[1] = NullKind;
      aStack_10a8._M_allocated_capacity._2_2_ = 0;
      aStack_10a8._M_allocated_capacity._4_4_ = 0;
      aStack_10a8._8_4_ = 0;
      aStack_10a8._12_4_ = 0;
      local_1098 = 0;
      (**(code **)(*local_1590.decUL + 0x28))
                (local_1590.twine,local_1588.twine,local_1598.twine,local_10b8);
      local_10b8._0_4_ = 1;
      local_10b8._4_4_ = 0xffffffff;
      CStack_10b0.decUI = 0xffffffff;
      aStack_10a8._M_local_buf[0] = NullKind;
      aStack_10a8._M_local_buf[1] = NullKind;
      aStack_10a8._M_allocated_capacity._2_2_ = 0;
      aStack_10a8._M_allocated_capacity._4_4_ = 0;
      aStack_10a8._8_4_ = 0;
      aStack_10a8._12_4_ = 0;
      local_1098 = 0;
      if ((completionFn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001e2b25;
      (*completionFn->_M_invoker)((_Any_data *)completionFn,(ProcessResult *)local_10b8);
      cVar12 = (char)local_1508;
      if (local_14c8.twine != (Twine *)&local_14b8) {
        operator_delete(local_14c8.twine,(ulong)(local_14b8 + 1));
      }
      bVar35 = -1 < (int)local_1558;
      bVar11 = true;
      uVar36 = local_157c;
    }
    if ((((-1 < (int)uVar36) || (cVar12 == '\0')) || (bVar35)) || (!bVar31)) goto LAB_001e2b68;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (!bVar11) {
    posix_spawn_file_actions_destroy(&local_12f0);
    posix_spawnattr_destroy(&local_1288);
    FVar8 = local_1550._descriptor;
    if (local_159c == 0xffffffff) {
      if (-1 < local_1550._descriptor) {
        local_1550._descriptor = 0xffffffff;
        local_1550._closedProperly = true;
        sys::close(FVar8);
      }
      FVar8 = local_1500._descriptor;
      if (-1 < local_1500._descriptor) {
        local_1500._descriptor = 0xffffffff;
        local_1500._closedProperly = true;
        sys::close(FVar8);
      }
      local_1308 = 0;
      uStack_1304 = 0;
      uStack_1300 = 0;
      uStack_12fc = 0;
      local_12f8 = 0;
      local_10b8._0_4_ = (byte)local_1458 + 1;
      local_10b8._4_4_ = 0xffffffff;
      CStack_10b0.decUI = 0xffffffff;
      aStack_10a8._12_4_ = 0;
      local_1098 = 0;
      CStack_10b0._4_4_ = uStack_130c;
      aStack_10a8._M_local_buf[0] = NullKind;
      aStack_10a8._M_local_buf[1] = NullKind;
      aStack_10a8._M_allocated_capacity._2_2_ = 0;
      aStack_10a8._M_allocated_capacity._4_4_ = 0;
      aStack_10a8._8_4_ = 0;
      if ((completionFn->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001e2b25:
        std::__throw_bad_function_call();
      }
      (*completionFn->_M_invoker)((_Any_data *)completionFn,(ProcessResult *)local_10b8);
    }
    else {
      local_14e8.fd = local_1550._descriptor;
      local_14e8.events = 0;
      local_14e8.revents = 0;
      uStack_14e0 = local_1500._descriptor;
      uStack_14dc = 0;
      llvm::Twine::str_abi_cxx11_((string *)local_10b8,&local_12a0);
      local_13a8.twine = (Twine *)&local_1398;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_13a8,CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                 CONCAT44(CStack_10b0._4_4_,CStack_10b0.decUI) +
                 CONCAT44(local_10b8._4_4_,local_10b8._0_4_));
      local_1388 = 0;
      local_1380 = &local_1370;
      local_1378 = 0;
      local_1370 = 0;
      local_1360 = '\0';
      local_1358 = 0x10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_) != &aStack_10a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                        CONCAT44(aStack_10a8._M_allocated_capacity._4_4_,
                                 CONCAT22(aStack_10a8._M_allocated_capacity._2_2_,
                                          aStack_10a8._M_allocated_capacity._0_2_)) + 1);
      }
      CVar17 = local_1598;
      local_1438.twine = (Twine *)0x0;
      uStack_1430 = 0;
      local_1428 = (code *)0x0;
      CStack_1420 = (Child)0x0;
      local_1438.twine = (Twine *)operator_new(0x18);
      CVar23 = local_1588;
      CVar28 = local_1590;
      (local_1438.stringRef)->Data = (char *)local_1590;
      *(Child *)&((local_1438.smallString)->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size =
           (Twine *)local_1588;
      *(Child *)&(local_1438.twine)->LHSKind = CVar17;
      CStack_1420.twine =
           (Twine *)std::
                    _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:976:5)>
                    ::_M_invoke;
      local_1428 = std::
                   _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:976:5)>
                   ::_M_manager;
      local_1408 = (Child *)0x0;
      pcStack_1400 = (code *)0x0;
      local_1418 = (Child *)0x0;
      uStack_1410 = 0;
      local_1418 = (Child *)operator_new(0x20);
      local_1418->twine = (Twine *)CVar28;
      local_1418[1].twine = (Twine *)&local_13a8;
      local_1418[2].twine = (Twine *)CVar23;
      local_1418[3] = CVar17;
      pcStack_1400 = std::
                     _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:982:5)>
                     ::_M_invoke;
      local_1408 = (Child *)std::
                            _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:982:5)>
                            ::_M_manager;
      if (attr.connectToConsole == false) {
        local_14e8.events = 1;
      }
      if (attr.controlEnabled == true) {
        uStack_14dc = CONCAT22(uStack_14dc._2_2_,1);
      }
      bVar31 = attr.controlEnabled == true || attr.connectToConsole == false;
      local_1558 = &(completionFn->super__Function_base)._M_manager;
      local_1458 = (_func_int **)&PTR___Sp_counted_ptr_inplace_0025b438;
      do {
        pPVar32 = local_14d0;
        FVar8 = local_1550._descriptor;
        if (!bVar31) {
          if (-1 < local_1550._descriptor) {
            local_1550._descriptor = 0xffffffff;
            local_1550._closedProperly = true;
            sys::close(FVar8);
          }
          cleanUpExecutedProcess
                    ((ProcessDelegate *)local_1590.twine,pPVar32,local_159c,
                     (ProcessHandle)local_1598,(ProcessContext *)local_1588.twine,completionFn,
                     &local_1500);
          break;
        }
        if (local_14e8.fd != local_1550._descriptor) {
          __assert_fail("readfds[0].fd == outputPipeParentEnd.unsafeDescriptor()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                        ,0x42f,
                        "void llbuild::basic::spawnProcess(ProcessDelegate &, ProcessContext *, ProcessGroup &, ProcessHandle, ArrayRef<StringRef>, POSIXEnvironment, ProcessAttributes, ProcessReleaseFn &&, ProcessCompletionFn &&)"
                       );
        }
        if (uStack_14e0 != local_1500._descriptor) {
          __assert_fail("readfds[1].fd == controlPipeParentEnd.unsafeDescriptor()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                        ,0x430,
                        "void llbuild::basic::spawnProcess(ProcessDelegate &, ProcessContext *, ProcessGroup &, ProcessHandle, ArrayRef<StringRef>, POSIXEnvironment, ProcessAttributes, ProcessReleaseFn &&, ProcessCompletionFn &&)"
                       );
        }
        iVar25 = poll(&local_14e8,2,-1);
        if (iVar25 == -1) {
          piVar16 = __errno_location();
          do {
            CVar17 = local_1598;
            iVar25 = *piVar16;
            if ((iVar25 != 0xb) && (iVar25 != 4)) {
              llvm::Twine::Twine((Twine *)local_1578,"failed to poll (");
              pcVar27 = strerror(iVar25);
              llvm::Twine::Twine((Twine *)&local_1520,pcVar27);
              if (((NodeKind)local_1568 == NullKind) || (local_1510 == NullKind)) {
                local_14b8 = (code *)CONCAT62(local_14b8._2_6_,0x100);
              }
              else {
                if ((NodeKind)local_1568 == EmptyKind) {
                  local_14b8 = (code *)CONCAT62(uStack_150e,CONCAT11(cStack_150f,local_1510));
                  local_14c8.decUI = local_1520.decUI;
                  local_14c8._4_4_ = local_1520._4_4_;
                  CStack_14c0.decUI = uStack_1518;
                  CStack_14c0._4_4_ = uStack_1514;
                }
                else {
                  if (local_1510 != EmptyKind) {
                    CVar28 = (Child)local_1578._0_8_;
                    NVar20 = (NodeKind)local_1568;
                    if (local_1568._1_1_ != EmptyKind) {
                      NVar20 = TwineKind;
                      CVar28.twine = (Twine *)local_1578;
                    }
                    NVar29 = local_1510;
                    if (cStack_150f != '\x01') {
                      NVar29 = TwineKind;
                    }
                    RHS_01._4_4_ = local_1520._4_4_;
                    RHS_01.decUI = local_1520.decUI;
                    if (cStack_150f != '\x01') {
                      RHS_01.twine = (Twine *)&local_1520;
                    }
                    llvm::Twine::Twine((Twine *)&local_14c8,CVar28,NVar20,RHS_01,NVar29);
                    goto LAB_001e2878;
                  }
                  local_14b8 = local_1568;
                  local_14c8.decUI = local_1578._0_4_;
                  local_14c8._4_4_ = local_1578._4_4_;
                  CStack_14c0.decUI = local_1578._8_4_;
                  CStack_14c0._4_4_ = uStack_156c;
                }
              }
LAB_001e2878:
              llvm::Twine::Twine((Twine *)&local_1538,")");
              if (((NodeKind)local_14b8 == NullKind) || (local_1528 == NullKind)) {
                aStack_10a8._M_local_buf[0] = NullKind;
                aStack_10a8._M_local_buf[1] = EmptyKind;
              }
              else if ((NodeKind)local_14b8 == EmptyKind) {
                aStack_10a8._M_local_buf[1] = NStack_1527;
                aStack_10a8._M_local_buf[0] = local_1528;
                aStack_10a8._M_allocated_capacity._2_2_ = (undefined2)uStack_1526;
                aStack_10a8._M_allocated_capacity._4_4_ = (undefined4)((uint6)uStack_1526 >> 0x10);
                local_10b8._0_4_ = local_1538.decUI;
                local_10b8._4_4_ = local_1538._4_4_;
                CStack_10b0.decUI = uStack_1530;
                CStack_10b0._4_4_ = uStack_152c;
              }
              else if (local_1528 == EmptyKind) {
                aStack_10a8._M_allocated_capacity._0_2_ = SUB82(local_14b8,0);
                aStack_10a8._M_allocated_capacity._2_2_ = (undefined2)((ulong)local_14b8 >> 0x10);
                aStack_10a8._M_allocated_capacity._4_4_ = (undefined4)((ulong)local_14b8 >> 0x20);
                local_10b8._0_4_ = local_14c8.decUI;
                local_10b8._4_4_ = local_14c8._4_4_;
                CStack_10b0.decUI = CStack_14c0.decUI;
                CStack_10b0._4_4_ = CStack_14c0._4_4_;
              }
              else {
                CVar28 = local_14c8;
                NVar20 = (NodeKind)local_14b8;
                if (local_14b8._1_1_ != '\x01') {
                  NVar20 = TwineKind;
                  CVar28.twine = (Twine *)&local_14c8;
                }
                NVar29 = local_1528;
                if (NStack_1527 != EmptyKind) {
                  NVar29 = TwineKind;
                }
                RHS_02._4_4_ = local_1538._4_4_;
                RHS_02.decUI = local_1538.decUI;
                if (NStack_1527 != EmptyKind) {
                  RHS_02.twine = (Twine *)&local_1538;
                }
                llvm::Twine::Twine((Twine *)local_10b8,CVar28,NVar20,RHS_02,NVar29);
              }
              (**(code **)(*local_1590.decUL + 0x18))
                        (local_1590.twine,local_1588.twine,CVar17.twine,local_10b8);
              bVar31 = false;
              goto LAB_001e29c5;
            }
            iVar25 = poll(&local_14e8,2,-1);
          } while (iVar25 == -1);
        }
        lVar22 = 0;
        pCVar33 = &local_1438;
        bVar31 = false;
        do {
          if (((&local_14e8)[lVar22].revents & 0x19) == 0) {
LAB_001e243c:
            bVar31 = (bool)(bVar31 | (&local_14e8)[lVar22].events != 0);
          }
          else {
            CVar17 = (Child)read((&local_14e8)[lVar22].fd,local_10b8,0x1000);
            if ((long)CVar17.twine < 0) {
              piVar16 = __errno_location();
              CVar28 = local_1598;
              iVar25 = *piVar16;
              llvm::Twine::Twine((Twine *)&local_1520,"unable to read process output (");
              pcVar27 = strerror(iVar25);
              llvm::Twine::Twine((Twine *)&local_1538,pcVar27);
              if ((local_1510 == NullKind) || (local_1528 == NullKind)) {
                local_1568 = (code *)CONCAT62(local_1568._2_6_,0x100);
              }
              else {
                if (local_1510 == EmptyKind) {
                  local_1568 = (code *)CONCAT62(uStack_1526,CONCAT11(NStack_1527,local_1528));
                  local_1578._0_4_ = local_1538.decUI;
                  local_1578._4_4_ = local_1538._4_4_;
                  local_1578._8_4_ = uStack_1530;
                  uStack_156c = uStack_152c;
                }
                else {
                  if (local_1528 != EmptyKind) {
                    NVar20 = local_1510;
                    if (cStack_150f != '\x01') {
                      NVar20 = TwineKind;
                    }
                    LHS_00._4_4_ = local_1520._4_4_;
                    LHS_00.decUI = local_1520.decUI;
                    if (cStack_150f != '\x01') {
                      LHS_00.twine = (Twine *)&local_1520;
                    }
                    NVar29 = local_1528;
                    if (NStack_1527 != EmptyKind) {
                      NVar29 = TwineKind;
                    }
                    RHS._4_4_ = local_1538._4_4_;
                    RHS.decUI = local_1538.decUI;
                    if (NStack_1527 != EmptyKind) {
                      RHS.twine = (Twine *)&local_1538;
                    }
                    llvm::Twine::Twine((Twine *)local_1578,LHS_00,NVar20,RHS,NVar29);
                    goto LAB_001e2325;
                  }
                  local_1568 = (code *)CONCAT62(uStack_150e,CONCAT11(cStack_150f,local_1510));
                  local_1578._0_4_ = local_1520.decUI;
                  local_1578._4_4_ = local_1520._4_4_;
                  local_1578._8_4_ = uStack_1518;
                  uStack_156c = uStack_1514;
                }
              }
LAB_001e2325:
              llvm::Twine::Twine((Twine *)&local_1450,")");
              if (((NodeKind)local_1568 == NullKind) || (local_1440 == NullKind)) {
                local_14b8 = (code *)CONCAT62(local_14b8._2_6_,0x100);
              }
              else {
                if ((NodeKind)local_1568 == EmptyKind) {
                  local_14b8 = (code *)CONCAT62(uStack_143e,CONCAT11(cStack_143f,local_1440));
                  local_14c8.decUI = local_1450.decUI;
                  local_14c8._4_4_ = local_1450._4_4_;
                  CStack_14c0.decUI = uStack_1448;
                  CStack_14c0._4_4_ = uStack_1444;
                }
                else {
                  if (local_1440 != EmptyKind) {
                    NVar20 = (NodeKind)local_1568;
                    if (local_1568._1_1_ != EmptyKind) {
                      NVar20 = TwineKind;
                    }
                    CVar23 = (Child)local_1578._0_8_;
                    if (local_1568._1_1_ != EmptyKind) {
                      CVar23.twine = (Twine *)local_1578;
                    }
                    NVar29 = local_1440;
                    if (cStack_143f != '\x01') {
                      NVar29 = TwineKind;
                    }
                    RHS_00._4_4_ = local_1450._4_4_;
                    RHS_00.decUI = local_1450.decUI;
                    if (cStack_143f != '\x01') {
                      RHS_00.twine = (Twine *)&local_1450;
                    }
                    llvm::Twine::Twine((Twine *)&local_14c8,CVar23,NVar20,RHS_00,NVar29);
                    goto LAB_001e23f0;
                  }
                  local_14b8 = local_1568;
                  local_14c8.decUI = local_1578._0_4_;
                  local_14c8._4_4_ = local_1578._4_4_;
                  CStack_14c0.decUI = local_1578._8_4_;
                  CStack_14c0._4_4_ = uStack_156c;
                }
              }
LAB_001e23f0:
              (**(code **)(*local_1590.decUL + 0x18))
                        (local_1590.twine,local_1588.twine,CVar28.twine,&local_14c8);
            }
            if (0 < (long)CVar17.twine) {
              local_14c8.twine = (Twine *)local_10b8;
              CStack_14c0 = CVar17;
              if (pCVar33[2].twine == (Twine *)0x0) goto LAB_001e2b25;
              cVar12 = (*pCVar33[3])(pCVar33,&local_14c8);
              if (cVar12 != '\0') goto LAB_001e243c;
            }
            (&local_14e8)[lVar22].events = 0;
          }
          lVar22 = lVar22 + 1;
          pCVar33 = pCVar33 + 4;
        } while (lVar22 == 1);
        bVar35 = true;
        if (local_1360 != '\0') {
          this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
          FVar8 = local_1550._descriptor;
          this->_M_use_count = 1;
          this->_M_weak_count = 1;
          this->_vptr__Sp_counted_base = local_1458;
          *(undefined4 *)&this[1]._vptr__Sp_counted_base = 0xffffffff;
          *(undefined1 *)((long)&this[1]._vptr__Sp_counted_base + 4) = 1;
          this[1]._M_use_count = 0;
          this[1]._M_weak_count = 0;
          *(undefined4 *)&this[2]._vptr__Sp_counted_base = 0;
          *(FileDescriptor *)&this[1]._vptr__Sp_counted_base = local_1550._descriptor;
          local_1550._descriptor = 0xffffffff;
          uVar21 = 0;
          if (FVar8 < 0) {
            uVar21 = local_1550._closedProperly;
          }
          *(undefined1 *)((long)&this[1]._vptr__Sp_counted_base + 4) = uVar21;
          local_1550._closedProperly = true;
          *(char **)&this[1]._M_use_count = local_1550._file;
          *(uint *)&this[2]._vptr__Sp_counted_base = local_1550._line;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
          FVar8 = local_1500._descriptor;
          this_00->_M_use_count = 1;
          this_00->_M_weak_count = 1;
          this_00->_vptr__Sp_counted_base = local_1458;
          *(undefined4 *)&this_00[1]._vptr__Sp_counted_base = 0xffffffff;
          *(undefined1 *)((long)&this_00[1]._vptr__Sp_counted_base + 4) = 1;
          this_00[1]._M_use_count = 0;
          this_00[1]._M_weak_count = 0;
          *(undefined4 *)&this_00[2]._vptr__Sp_counted_base = 0;
          *(FileDescriptor *)&this_00[1]._vptr__Sp_counted_base = local_1500._descriptor;
          local_1500._descriptor = 0xffffffff;
          uVar36 = 0;
          if (FVar8 < 0) {
            uVar36 = local_1500._4_4_;
          }
          local_14a0 = this + 1;
          *(char *)((long)&this_00[1]._vptr__Sp_counted_base + 4) = (char)uVar36;
          local_1500._closedProperly = true;
          *(char **)&this_00[1]._M_use_count = local_1500._file;
          *(uint *)&this_00[2]._vptr__Sp_counted_base = local_1500._line;
          local_14c8 = local_1590;
          CStack_14c0.twine = (Twine *)local_14d0;
          local_14b8 = (code *)CONCAT44(local_14b8._4_4_,local_159c);
          CStack_14b0 = local_1598;
          local_14a8 = local_1588;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
          local_1490 = (Twine *)(this_00 + 1);
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          local_1480._M_unused._M_object = (Twine *)0x0;
          local_1480._8_8_ = (Twine *)0x0;
          local_1470 = (_Manager_type)0x0;
          CStack_1468 = (Child)completionFn->_M_invoker;
          p_Var2 = (completionFn->super__Function_base)._M_manager;
          if (p_Var2 != (_Manager_type)0x0) {
            local_1480._M_unused._0_8_ =
                 (undefined8)*(undefined8 *)&(completionFn->super__Function_base)._M_functor;
            local_1480._8_8_ =
                 *(undefined8 *)((long)&(completionFn->super__Function_base)._M_functor + 8);
            *local_1558 = (_Manager_type)0x0;
            local_1558[1] = (_Manager_type)0x0;
            local_1470 = p_Var2;
          }
          local_1568._0_1_ = NullKind;
          local_1568._1_1_ = NullKind;
          local_1568._2_6_ = 0;
          pcStack_1560 = (code *)0x0;
          local_1578._0_8_ = (Twine *)0x0;
          stack0xffffffffffffea90 = (Twine *)0x0;
          local_1498 = this;
          local_1488 = this_00;
          local_1578._0_8_ = operator_new(0x68);
          p_Var10 = local_1488;
          p_Var9 = local_1498;
          ((Twine *)local_1578._0_8_)->LHS = local_14c8;
          ((Twine *)local_1578._0_8_)->RHS = CStack_14c0;
          *(code **)&((Twine *)local_1578._0_8_)->LHSKind = local_14b8;
          *(Child *)((long)&((string *)local_1578._0_8_)->field_2 + 8) = CStack_14b0;
          ((Twine *)(local_1578._0_8_ + 0x18))->RHS = local_14a8;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           &((Twine *)(local_1578._0_8_ + 0x18))->LHSKind = local_14a0;
          (((Twine *)(local_1578._0_8_ + 0x30))->LHS).twine = (Twine *)0x0;
          local_1498 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (((Twine *)(local_1578._0_8_ + 0x30))->LHS).smallString = (SmallVectorImpl<char> *)p_Var9;
          local_14a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (((Twine *)(local_1578._0_8_ + 0x30))->RHS).twine = local_1490;
          ((Twine *)(local_1578._0_8_ + 0x30))->LHSKind = NullKind;
          ((Twine *)(local_1578._0_8_ + 0x30))->RHSKind = NullKind;
          *(undefined6 *)&((Twine *)(local_1578._0_8_ + 0x30))->field_0x12 = 0;
          local_1488 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           &((Twine *)(local_1578._0_8_ + 0x30))->LHSKind = p_Var10;
          local_1490 = (Twine *)0x0;
          ((Twine *)(local_1578._0_8_ + 0x48))->LHSKind = NullKind;
          ((Twine *)(local_1578._0_8_ + 0x48))->RHSKind = NullKind;
          *(undefined6 *)&((Twine *)(local_1578._0_8_ + 0x48))->field_0x12 = 0;
          (((Twine *)(local_1578._0_8_ + 0x48))->LHS).twine = (Twine *)0x0;
          (((Twine *)(local_1578._0_8_ + 0x48))->RHS).twine = (Twine *)0x0;
          ((Twine *)(local_1578._0_8_ + 0x60))->LHS = CStack_1468;
          if (local_1470 != (_Manager_type)0x0) {
            (((Twine *)(local_1578._0_8_ + 0x48))->LHS).twine = (Twine *)local_1480._M_unused._0_8_;
            (((Twine *)(local_1578._0_8_ + 0x48))->RHS).twine = (Twine *)local_1480._8_8_;
            *(_Manager_type *)&((Twine *)(local_1578._0_8_ + 0x48))->LHSKind = local_1470;
            local_1470 = (_Manager_type)0x0;
            CStack_1468.twine = (Twine *)0x0;
          }
          pcStack_1560 = std::
                         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:1107:17)>
                         ::_M_invoke;
          local_1568 = std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:1107:17)>
                       ::_M_manager;
          if ((releaseFn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001e2b25;
          (*releaseFn->_M_invoker)((_Any_data *)releaseFn,(function<void_()> *)local_1578);
          if (local_1568 != (code *)0x0) {
            (*local_1568)((_Any_data *)local_1578,(_Any_data *)local_1578,__destroy_functor);
          }
          if (local_1470 != (_Manager_type)0x0) {
            (*local_1470)(&local_1480,&local_1480,__destroy_functor);
          }
          if (local_1488 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1488);
          }
          if (local_1498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1498);
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
LAB_001e29c5:
          bVar35 = false;
        }
      } while (bVar35);
      lVar22 = -0x40;
      ppCVar24 = &local_1418;
      do {
        if (ppCVar24[2] != (Child *)0x0) {
          (*(code *)ppCVar24[2])(ppCVar24,ppCVar24,3);
        }
        ppCVar24 = ppCVar24 + -4;
        lVar22 = lVar22 + 0x20;
      } while (lVar22 != 0);
      if (local_1380 != &local_1370) {
        operator_delete(local_1380,CONCAT71(uStack_136f,local_1370) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13a8.twine != &local_1398) {
        operator_delete(local_13a8.twine,(ulong)(local_1398._M_allocated_capacity + 1));
      }
    }
  }
  if ((((local_1500._descriptor < 0) && (local_1500._closedProperly != false)) &&
      (local_1550._descriptor < 0)) && (local_1550._closedProperly != false)) {
    if (local_1330 != &local_1320) {
      operator_delete(local_1330,CONCAT71(uStack_131f,local_1320) + 1);
    }
    if (local_13c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (char **)0x0) {
      operator_delete(local_13c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_13c0.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_13c0.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_13d8);
    return;
  }
LAB_001e2b68:
  __assert_fail("!isValid() && _closedProperly",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                ,0x102,"ManagedDescriptor::~ManagedDescriptor()");
}

Assistant:

void llbuild::basic::spawnProcess(
    ProcessDelegate& delegate,
    ProcessContext* ctx,
    ProcessGroup& pgrp,
    ProcessHandle handle,
    ArrayRef<StringRef> commandLine,
    POSIXEnvironment environment,
    ProcessAttributes attr,
    ProcessReleaseFn&& releaseFn,
    ProcessCompletionFn&& completionFn
) {
  llbuild_pid_t pid = (llbuild_pid_t)-1;
  
#if !defined(_WIN32) && !defined(HAVE_POSIX_SPAWN)
  auto result = ProcessResult::makeFailed();
  delegate.processStarted(ctx, handle, pid);
  delegate.processHadError(ctx, handle, Twine("process spawning is unavailable"));
  delegate.processFinished(ctx, handle, result);
  completionFn(result);
  return;
#else
  // Don't use lane release feature for console workloads.
  if (attr.connectToConsole) {
    attr.controlEnabled = false;
  }

#if defined(_WIN32)
  // Control channel support is broken (thread-unsafe) on Windows.
  attr.controlEnabled = false;
#endif

  if (commandLine.size() == 0) {
    auto result = ProcessResult::makeFailed();
    delegate.processStarted(ctx, handle, pid);
    delegate.processHadError(ctx, handle, Twine("no arguments for command"));
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }

  // Form the complete C string command line.
  std::vector<std::string> argsStorage(commandLine.begin(), commandLine.end());
#if defined(_WIN32)
  std::string args = llbuild::basic::formatWindowsCommandString(argsStorage);

  // Convert the command line string to utf16
  llvm::SmallVector<llvm::UTF16, 20> u16Executable;
  llvm::SmallVector<llvm::UTF16, 20> u16CmdLine;
  llvm::convertUTF8ToUTF16String(argsStorage[0], u16Executable);
  llvm::convertUTF8ToUTF16String(args, u16CmdLine);
#else
  std::vector<const char*> args(argsStorage.size() + 1);
  for (size_t i = 0; i != argsStorage.size(); ++i) {
    args[i] = argsStorage[i].c_str();
  }
  args[argsStorage.size()] = nullptr;
#endif

#if defined(_WIN32)
  DWORD creationFlags = NORMAL_PRIORITY_CLASS |
                        CREATE_UNICODE_ENVIRONMENT;
  PROCESS_INFORMATION processInfo = {0};

#else
  // Initialize the spawn attributes.
  posix_spawnattr_t attributes;
  posix_spawnattr_init(&attributes);

  // Unmask all signals.
  sigset_t noSignals;
  sigemptyset(&noSignals);
  posix_spawnattr_setsigmask(&attributes, &noSignals);

  // Reset all signals to default behavior.
  //
  // On Linux, this can only be used to reset signals that are legal to
  // modify, so we have to take care about the set we use.
#if defined(__linux__)
  sigset_t mostSignals;
  sigemptyset(&mostSignals);
  for (int i = 1; i < SIGSYS; ++i) {
    if (i == SIGKILL || i == SIGSTOP) continue;
    sigaddset(&mostSignals, i);
  }
  posix_spawnattr_setsigdefault(&attributes, &mostSignals);
#else
  sigset_t mostSignals;
  sigfillset(&mostSignals);
  sigdelset(&mostSignals, SIGKILL);
  sigdelset(&mostSignals, SIGSTOP);
  posix_spawnattr_setsigdefault(&attributes, &mostSignals);
#endif // else !defined(_WIN32)

  // Establish a separate process group.
  posix_spawnattr_setpgroup(&attributes, 0);

  // Set the attribute flags.
  unsigned flags = POSIX_SPAWN_SETSIGMASK | POSIX_SPAWN_SETSIGDEF;
  if (!attr.connectToConsole) {
    flags |= POSIX_SPAWN_SETPGROUP;
  }

  // Close all other files by default.
  //
  // FIXME: Note that this is an Apple-specific extension, and we will have to
  // do something else on other platforms (and unfortunately, there isn't
  // really an easy answer other than using a stub executable).
#ifdef __APPLE__
  flags |= POSIX_SPAWN_CLOEXEC_DEFAULT;
#endif

  // On Darwin, set the QoS of launched processes to one of the current thread.
#ifdef __APPLE__
  posix_spawnattr_set_qos_class_np(&attributes, qos_class_self());
#endif

  posix_spawnattr_setflags(&attributes, flags);

  // Setup the file actions.
  posix_spawn_file_actions_t fileActions;
  posix_spawn_file_actions_init(&fileActions);

  bool usePosixSpawnChdirFallback = true;
  const auto workingDir = attr.workingDir.str();
  if (!workingDir.empty() &&
      posix_spawn_file_actions_addchdir(&fileActions, workingDir.c_str()) != ENOSYS) {
    usePosixSpawnChdirFallback = false;
  }

#endif

#if defined(_WIN32)
  /// Process startup information for Windows.
  STARTUPINFOW startupInfo = {0};
  PlatformSpecificPipesConfig& pipesConfig = startupInfo;
#else
  PlatformSpecificPipesConfig& pipesConfig = fileActions;
#endif

  // Automatically managed (released) descriptors for output and control pipes.
  // The child ends are forwarded to the child (and quickly released in the
  // parent). The parent ends are retained and read/written by the parent.
  ManagedDescriptor outputPipeParentEnd{__FILE__, __LINE__};
  ManagedDescriptor controlPipeParentEnd{__FILE__, __LINE__};

#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> u16Cwd;
  std::string workingDir = attr.workingDir.str();
  if (!workingDir.empty()) {
    llvm::convertUTF8ToUTF16String(workingDir, u16Cwd);
  }
#endif

  // Export a task ID to subprocesses.
  auto taskID = Twine::utohexstr(handle.id);
  environment.setIfMissing("LLBUILD_TASK_ID", taskID.str());

  // Resolve the executable path, if necessary.
  //
  // FIXME: This should be cached.
  if (!llvm::sys::path::is_absolute(argsStorage[0])) {
    auto res = llvm::sys::findProgramByName(argsStorage[0]);
    if (!res.getError()) {
      argsStorage[0] = *res;
#if defined(_WIN32)
      u16Executable.clear();
      llvm::convertUTF8ToUTF16String(argsStorage[0], u16Executable);
#else
      args[0] = argsStorage[0].c_str();
#endif
    }
  }

  // Spawn the command.
  bool wasCancelled;
  do {
      // We need to hold the spawn processes lock when we spawn, to ensure that
      // we don't create a process in between when we are cancelled.
      std::lock_guard<std::mutex> guard(pgrp.mutex);
      wasCancelled = pgrp.isClosed();

      // If we have been cancelled since we started, skip startup.
      if (wasCancelled) { break; }

      // The partf of the control pipes that are inherited by the child.
      ManagedDescriptor outputPipeChildEnd{__FILE__, __LINE__};
      ManagedDescriptor controlPipeChildEnd{__FILE__, __LINE__};

      // Open the communication channel under the mutex to avoid
      // leaking the wrong channel into other children started concurrently.
      auto errorPair = createCommunicationPipes(attr, pipesConfig, outputPipeParentEnd, outputPipeChildEnd, controlPipeParentEnd, controlPipeChildEnd);
      if (errorPair.first != CommunicationPipesCreationError::ERROR_NONE) {
        std::string whatPipe = errorPair.first == CommunicationPipesCreationError::OUTPUT_PIPE_FAILED ? "output pipe" : "control pipe";
#if !defined(_WIN32)
        posix_spawn_file_actions_destroy(&fileActions);
        posix_spawnattr_destroy(&attributes);
#endif
        delegate.processStarted(ctx, handle, pid);
        delegate.processHadError(ctx, handle,
            Twine("unable to open " + whatPipe + " (") + strerror(errorPair.second) + ")");
        delegate.processFinished(ctx, handle, ProcessResult::makeFailed());
        completionFn(ProcessResult(ProcessStatus::Failed));
        return;
      }

      if (controlPipeChildEnd.isValid()) {
        long long controlFd = (long long)controlPipeChildEnd.unsafeDescriptor();
        environment.setIfMissing("LLBUILD_CONTROL_FD", Twine(controlFd).str());
      }

      int result = 0;

      bool workingDirectoryUnsupported = false;

#if !defined(_WIN32)
      if (usePosixSpawnChdirFallback) {
#if defined(__APPLE__)
        thread_local std::string threadWorkingDir;

        if (workingDir.empty()) {
          if (!threadWorkingDir.empty()) {
            pthread_fchdir_np(-1);
            threadWorkingDir.clear();
          }
        } else {
          if (threadWorkingDir != workingDir) {
            if (pthread_chdir_np(workingDir.c_str()) == -1) {
              result = errno;
            } else {
              threadWorkingDir = workingDir;
            }
          }
        }
#else
        if (!workingDir.empty()) {
          workingDirectoryUnsupported = true;
          result = -1;
        }
#endif // if defined(__APPLE__)
      }
#endif // else !defined(_WIN32)

      if (result == 0) {
#if defined(_WIN32)
        auto unicodeEnv = environment.getWindowsEnvp();
        result = !CreateProcessW(
            /*lpApplicationName=*/(LPWSTR)u16Executable.data(),
            (LPWSTR)u16CmdLine.data(),
            /*lpProcessAttributes=*/NULL,
            /*lpThreadAttributes=*/NULL,
            /*bInheritHandles=*/TRUE, creationFlags,
            /*lpEnvironment=*/unicodeEnv.get(),
            /*lpCurrentDirectory=*/u16Cwd.empty() ? NULL
                                                  : (LPWSTR)u16Cwd.data(),
            &startupInfo, &processInfo);
#else
        result =
            posix_spawn(&pid, args[0], /*file_actions=*/&fileActions,
                        /*attrp=*/&attributes, const_cast<char**>(args.data()),
                        const_cast<char* const*>(environment.getEnvp()));
#endif
      }
    
      delegate.processStarted(ctx, handle, pid);

      if (result != 0) {
        auto processResult = ProcessResult::makeFailed();
#if defined(_WIN32)
        result = GetLastError();
#endif
        delegate.processHadError(
            ctx, handle,
            workingDirectoryUnsupported
                ? Twine("working-directory unsupported on this platform")
                : Twine("unable to spawn process '") + argsStorage[0] + "' (" + sys::strerror(result) +
                      ")");
        delegate.processFinished(ctx, handle, processResult);
        pid = (llbuild_pid_t)-1;
      } else {
#if defined(_WIN32)
        pid = processInfo.hProcess;
#endif
        ProcessInfo info{ attr.canSafelyInterrupt };
        pgrp.add(std::move(guard), pid, info);
      }

    // Close the child ends of the forwarded output and control pipes.
    controlPipeChildEnd.close();
    outputPipeChildEnd.close();
  } while(false);

#if !defined(_WIN32)
  posix_spawn_file_actions_destroy(&fileActions);
  posix_spawnattr_destroy(&attributes);
#endif

  // If we failed to launch a process, clean up and abort.
  if (pid == (llbuild_pid_t)-1) {
    // Manually close to avoid triggering debug-time leak check.
    outputPipeParentEnd.close();
    controlPipeParentEnd.close();
    auto result = wasCancelled ? ProcessResult::makeCancelled() : ProcessResult::makeFailed();
    completionFn(result);
    return;
  }

#if !defined(_WIN32)
  // Set up our poll() structures. We use assert() to ensure
  // the file descriptors are alive.
  pollfd readfds[] = {
    { outputPipeParentEnd.unsafeDescriptor(), 0, 0 },
    { controlPipeParentEnd.unsafeDescriptor(), 0, 0 }
  };
  bool activeEvents = false;
#endif
  const int nfds = 2;
  ControlProtocolState control(taskID.str());
  std::function<bool (StringRef)> readCbs[] = {
    // output capture callback
    [&delegate, ctx, handle](StringRef buf) -> bool {
      // Notify the client of the output.
      delegate.processHadOutput(ctx, handle, buf);
      return true;
    },
    // control callback handle
    [&delegate, &control, ctx, handle](StringRef buf) mutable -> bool {
      std::string errstr;
      int ret = control.read(buf, &errstr);
      if (ret < 0) {
        delegate.processHadError(ctx, handle,
                                 Twine("control protocol error" + errstr));
      }
      return (ret == 0);
    }
  };
#if defined(_WIN32)
  struct threadData {
    std::function<void(void*)> reader;
    const ManagedDescriptor& handle;
    std::function<bool(StringRef)> cb;
  };
  HANDLE readers[2] = {NULL, NULL};
  auto reader = [&delegate, handle, ctx](void* lpArgs) {
    threadData* args = (threadData*)lpArgs;
    for (;;) {
      char buf[4096];
      DWORD numBytes;
      bool result = ReadFile(args->handle.unsafeDescriptor(), buf, sizeof(buf), &numBytes, NULL);

      if (!result || numBytes == 0) {
        if (GetLastError() == ERROR_BROKEN_PIPE) {
          // Pipe done, exit
          return;
        } else {
          delegate.processHadError(ctx, handle,
                                   Twine("unable to read process output (") +
                                       sys::strerror(GetLastError()) + ")");
        }
      }

      if (numBytes <= 0 || !args->cb(StringRef(buf, numBytes))) {
        continue;
      }
    }
  };

  struct threadData outputThreadParams = {reader, outputPipeParentEnd, readCbs[0]};
  struct threadData controlThreadParams = {reader, controlPipeParentEnd, readCbs[1]};
  HANDLE threads[2] = {NULL, NULL};
#endif // defined(_WIN32)

  int threadCount = 0;

  // Read the command output, if capturing instead of pass-throughing.
  if (!attr.connectToConsole) {
#if defined(_WIN32)
    threads[threadCount++] = (HANDLE)_beginthread(
        [](LPVOID lpParams) { ((threadData*)lpParams)->reader(lpParams); }, 0,
        &outputThreadParams);
#else
    readfds[0].events = POLLIN;
    activeEvents = true;
    (void)threadCount;
#endif
  }

  // Process the control channel input.
  if (attr.controlEnabled) {
#if defined(_WIN32)
    threads[threadCount++] = (HANDLE)_beginthread(
        [](LPVOID lpParams) { ((threadData*)lpParams)->reader(lpParams); }, 0,
        &controlThreadParams);
#else
    readfds[1].events = POLLIN;
    activeEvents = true;
#endif
  }

#if defined(_WIN32)
  DWORD waitResult = WaitForMultipleObjects(threadCount, threads,
                                            /*bWaitAll=*/false,
                                            /*dwMilliseconds=*/INFINITE);
  if (WAIT_FAILED == waitResult || WAIT_TIMEOUT == waitResult) {
    int err = GetLastError();
    delegate.processHadError(
        ctx, handle, Twine("failed to poll (") + sys::strerror(err) + ")");
  }
#else  // !defined(_WIN32)
  while (activeEvents) {
    char buf[4096];
    activeEvents = false;

    // Ensure we haven't autoclosed the file descriptors,
    // or move()d somewhere they could be autoclosed in.
    assert(readfds[0].fd == outputPipeParentEnd.unsafeDescriptor());
    assert(readfds[1].fd == controlPipeParentEnd.unsafeDescriptor());

    while (poll(readfds, nfds, -1) == -1) {
        int err = errno;

        if (err == EAGAIN || err == EINTR) {
          continue;
        } else {
          delegate.processHadError(ctx, handle,
            Twine("failed to poll (") + strerror(err) + ")"); 
          return;
        }
    }

    for (int i = 0; i < nfds; i++) {
      if (readfds[i].revents & (POLLIN | POLLERR | POLLHUP)) {
        ssize_t numBytes = read(readfds[i].fd, buf, sizeof(buf));
        if (numBytes < 0) {
          int err = errno;
          delegate.processHadError(ctx, handle,
              Twine("unable to read process output (") + strerror(err) + ")");
        }
        if (numBytes <= 0 || !readCbs[i](StringRef(buf, numBytes))) {
          readfds[i].events = 0;
          continue;
        }
      }
      activeEvents |= readfds[i].events != 0;
    }

    if (control.shouldRelease()) {
      std::shared_ptr<ManagedDescriptor> outputFdShared
        = std::make_shared<ManagedDescriptor>(std::move(outputPipeParentEnd));
      std::shared_ptr<ManagedDescriptor> controlFdShared
        = std::make_shared<ManagedDescriptor>(std::move(controlPipeParentEnd));
      releaseFn([&delegate, &pgrp, pid, handle, ctx,
                 outputFdShared, controlFdShared,
                 completionFn=std::move(completionFn)]() mutable {
        if (outputFdShared->isValid()) {
          captureExecutedProcessOutput(delegate, *outputFdShared, handle, ctx);
        }
        cleanUpExecutedProcess(delegate, pgrp, pid, handle, ctx,
                               std::move(completionFn), *controlFdShared);
      });
      return;
    }

  }
#endif // else !defined(_WIN32)
  // If we have reached here, both the control and read pipes have given us
  // the requisite EOF/hang-up events. Safe to close the read end of the
  // output pipe.
  outputPipeParentEnd.close();
  cleanUpExecutedProcess(delegate, pgrp, pid, handle, ctx,
                         std::move(completionFn), controlPipeParentEnd);
#endif
}